

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_padlock.c
# Opt level: O0

int padlock_ciphers(ENGINE *e,EVP_CIPHER **cipher,int **nids,int nid)

{
  EVP_CIPHER *pEVar1;
  int in_ECX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int local_4;
  
  if (in_RSI == (undefined8 *)0x0) {
    *in_RDX = padlock_cipher_nids;
    local_4 = padlock_cipher_nids_num;
  }
  else {
    if (in_ECX == 0x1a2) {
      pEVar1 = padlock_aes_128_ecb();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x1a3) {
      pEVar1 = padlock_aes_128_cbc();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x1a4) {
      pEVar1 = padlock_aes_128_ofb();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x1a5) {
      pEVar1 = padlock_aes_128_cfb();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x1a6) {
      pEVar1 = padlock_aes_192_ecb();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x1a7) {
      pEVar1 = padlock_aes_192_cbc();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x1a8) {
      pEVar1 = padlock_aes_192_ofb();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x1a9) {
      pEVar1 = padlock_aes_192_cfb();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x1aa) {
      pEVar1 = padlock_aes_256_ecb();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x1ab) {
      pEVar1 = padlock_aes_256_cbc();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x1ac) {
      pEVar1 = padlock_aes_256_ofb();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x1ad) {
      pEVar1 = padlock_aes_256_cfb();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x388) {
      pEVar1 = padlock_aes_128_ctr();
      *in_RSI = pEVar1;
    }
    else if (in_ECX == 0x389) {
      pEVar1 = padlock_aes_192_ctr();
      *in_RSI = pEVar1;
    }
    else {
      if (in_ECX != 0x38a) {
        *in_RSI = 0;
        return 0;
      }
      pEVar1 = padlock_aes_256_ctr();
      *in_RSI = pEVar1;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
padlock_ciphers(ENGINE *e, const EVP_CIPHER **cipher, const int **nids,
                int nid)
{
    /* No specific cipher => return a list of supported nids ... */
    if (!cipher) {
        *nids = padlock_cipher_nids;
        return padlock_cipher_nids_num;
    }

    /* ... or the requested "cipher" otherwise */
    switch (nid) {
    case NID_aes_128_ecb:
        *cipher = padlock_aes_128_ecb();
        break;
    case NID_aes_128_cbc:
        *cipher = padlock_aes_128_cbc();
        break;
    case NID_aes_128_cfb:
        *cipher = padlock_aes_128_cfb();
        break;
    case NID_aes_128_ofb:
        *cipher = padlock_aes_128_ofb();
        break;
    case NID_aes_128_ctr:
        *cipher = padlock_aes_128_ctr();
        break;

    case NID_aes_192_ecb:
        *cipher = padlock_aes_192_ecb();
        break;
    case NID_aes_192_cbc:
        *cipher = padlock_aes_192_cbc();
        break;
    case NID_aes_192_cfb:
        *cipher = padlock_aes_192_cfb();
        break;
    case NID_aes_192_ofb:
        *cipher = padlock_aes_192_ofb();
        break;
    case NID_aes_192_ctr:
        *cipher = padlock_aes_192_ctr();
        break;

    case NID_aes_256_ecb:
        *cipher = padlock_aes_256_ecb();
        break;
    case NID_aes_256_cbc:
        *cipher = padlock_aes_256_cbc();
        break;
    case NID_aes_256_cfb:
        *cipher = padlock_aes_256_cfb();
        break;
    case NID_aes_256_ofb:
        *cipher = padlock_aes_256_ofb();
        break;
    case NID_aes_256_ctr:
        *cipher = padlock_aes_256_ctr();
        break;

    default:
        /* Sorry, we don't support this NID */
        *cipher = NULL;
        return 0;
    }

    return 1;
}